

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AcosLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_acos(NeuralNetworkLayer *this)

{
  bool bVar1;
  AcosLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_acos(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_acos(this);
    this_00 = (AcosLayerParams *)operator_new(0x18);
    AcosLayerParams::AcosLayerParams(this_00);
    (this->layer_).acos_ = this_00;
  }
  return (AcosLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AcosLayerParams* NeuralNetworkLayer::mutable_acos() {
  if (!has_acos()) {
    clear_layer();
    set_has_acos();
    layer_.acos_ = new ::CoreML::Specification::AcosLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.acos)
  return layer_.acos_;
}